

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O3

int __thiscall
CRegexSearcherSimple::search_back_for_pattern
          (CRegexSearcherSimple *this,re_compiled_pattern *pattern,char *entirestr,char *searchstr,
          size_t searchlen,int *result_len)

{
  int iVar1;
  int iVar2;
  
  this->group_cnt_ = (pattern->super_re_compiled_pattern_base).group_cnt;
  *(undefined4 *)&(this->super_CRegexSearcher).field_0x24 = 0xffffffff;
  *(undefined4 *)&this->field_0x28 = 0xffffffff;
  *(undefined4 *)&this->field_0x2c = 0xffffffff;
  *(undefined4 *)&this->field_0x30 = 0xffffffff;
  *(undefined4 *)&this->field_0x34 = 0xffffffff;
  *(undefined4 *)&this->field_0x38 = 0xffffffff;
  *(undefined4 *)&this->field_0x3c = 0xffffffff;
  *(undefined4 *)&this->field_0x40 = 0xffffffff;
  *(undefined4 *)&this->field_0x44 = 0xffffffff;
  *(undefined4 *)&this->field_0x48 = 0xffffffff;
  *(undefined4 *)&this->field_0x4c = 0xffffffff;
  *(undefined4 *)&this->field_0x50 = 0xffffffff;
  *(undefined4 *)&this->field_0x54 = 0xffffffff;
  *(undefined4 *)&this->field_0x58 = 0xffffffff;
  *(undefined4 *)&this->field_0x5c = 0xffffffff;
  *(undefined4 *)&this->field_0x60 = 0xffffffff;
  *(undefined4 *)&this->field_0x64 = 0xffffffff;
  *(undefined4 *)&this->field_0x68 = 0xffffffff;
  *(undefined4 *)&this->field_0x6c = 0xffffffff;
  *(undefined4 *)&this->field_0x70 = 0xffffffff;
  (this->match_).start_ofs = -1;
  (this->match_).end_ofs = -1;
  iVar1 = CRegexSearcher::search_back_for_pattern
                    (&this->super_CRegexSearcher,pattern,entirestr,searchstr,searchlen,result_len,
                     (re_group_register *)&(this->super_CRegexSearcher).field_0x24);
  if (-1 < iVar1) {
    iVar2 = (int)searchstr - ((int)entirestr + iVar1);
    (this->match_).start_ofs = iVar2;
    (this->match_).end_ofs = iVar2 + *result_len;
  }
  return iVar1;
}

Assistant:

int search_back_for_pattern(const re_compiled_pattern *pattern,
                                const char *entirestr,
                                const char *searchstr, size_t searchlen,
                                int *result_len)
    {
        /* remember the group count from the compiled pattern */
        group_cnt_ = pattern->group_cnt;

        /* clear the group registers */
        clear_group_regs();

        /* search for the compiled pattern using our group register */
        int m = CRegexSearcher::search_back_for_pattern(
            pattern, entirestr, searchstr, searchlen, result_len, regs_);

        /* save the match information on success */
        if (m >= 0)
        {
            match_.start_ofs = searchstr - entirestr - m;
            match_.end_ofs = match_.start_ofs + *result_len;
        }

        /* return the result */
        return m;
    }